

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

void SetMaterialTextureProperty
               (vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *param_2,TextureInfo prop,
               aiMaterial *mat,aiTextureType texType,uint texSlot)

{
  int iVar1;
  Texture *pTVar2;
  vector<glTF2::Image_*,_std::allocator<glTF2::Image_*>_> *pvVar3;
  ulong uVar4;
  vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *pvVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  aiTextureMapMode wrapT;
  ulong local_c48;
  aiTextureMapMode wrapS;
  aiString uri;
  aiString id;
  aiString name;
  
  if (prop.texture.vector != (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0) {
    pTVar2 = ((prop.texture.vector)->
             super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>)._M_impl.
             super__Vector_impl_data._M_start[prop.texture.index];
    pvVar3 = (pTVar2->source).vector;
    if (pvVar3 != (vector<glTF2::Image_*,_std::allocator<glTF2::Image_*>_> *)0x0) {
      uVar7 = (ulong)(pTVar2->source).index;
      lVar8 = *(long *)(*(long *)&(pvVar3->
                                  super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                                  )._M_impl + uVar7 * 8);
      uVar4 = *(ulong *)(lVar8 + 0x58);
      sVar9 = 0x3ff;
      if ((uVar4 & 0xfffffc00) == 0) {
        sVar9 = uVar4 & 0xffffffff;
      }
      uri.length = (ai_uint32)sVar9;
      memcpy(uri.data,*(void **)(lVar8 + 0x50),sVar9);
      uri.data[sVar9] = '\0';
      iVar1 = (embeddedTexIdxs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      if (iVar1 != -1) {
        uri.data[0] = '*';
        uVar6 = Assimp::ASSIMP_itoa10(uri.data + 1,0x3ff,iVar1);
        uri.length = uVar6 + 1;
      }
      aiMaterial::AddProperty(mat,&uri,"$tex.file",texType,texSlot);
      aiMaterial::AddProperty<unsigned_int>
                (mat,&prop.texCoord,1,"$tex.file.texCoord",texType,texSlot);
      pTVar2 = ((prop.texture.vector)->
               super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>)._M_impl.
               super__Vector_impl_data._M_start[prop.texture.index];
      pvVar5 = (pTVar2->sampler).vector;
      if (pvVar5 != (vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *)0x0) {
        local_c48 = (ulong)(pTVar2->sampler).index;
        lVar8 = *(long *)(*(long *)&(pvVar5->
                                    super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                    )._M_impl + local_c48 * 8);
        sVar9 = *(ulong *)(lVar8 + 0x38) & 0xffffffff;
        if ((*(ulong *)(lVar8 + 0x38) & 0xfffffc00) != 0) {
          sVar9 = 0x3ff;
        }
        name.length = (ai_uint32)sVar9;
        memcpy(name.data,*(void **)(lVar8 + 0x30),sVar9);
        name.data[sVar9] = '\0';
        sVar9 = 0x3ff;
        if ((*(ulong *)(lVar8 + 0x18) & 0xfffffc00) == 0) {
          sVar9 = *(ulong *)(lVar8 + 0x18) & 0xffffffff;
        }
        id.length = (ai_uint32)sVar9;
        memcpy(id.data,*(void **)(lVar8 + 0x10),sVar9);
        id.data[sVar9] = '\0';
        aiMaterial::AddProperty(mat,&name,"$tex.mappingname",texType,texSlot);
        aiMaterial::AddProperty(mat,&id,"$tex.mappingid",texType,texSlot);
        uVar4 = local_c48;
        lVar8 = *(long *)(*(long *)&(pvVar5->
                                    super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                    )._M_impl + local_c48 * 8);
        iVar1 = *(int *)(lVar8 + 0x58);
        wrapS = (uint)(iVar1 == 0x812f);
        if (iVar1 == 0x8370) {
          wrapS = aiTextureMapMode_Mirror;
        }
        iVar1 = *(int *)(lVar8 + 0x5c);
        wrapT = (uint)(iVar1 == 0x812f);
        if (iVar1 == 0x8370) {
          wrapT = aiTextureMapMode_Mirror;
        }
        aiMaterial::AddProperty<aiTextureMapMode>(mat,&wrapS,1,"$tex.mapmodeu",texType,texSlot);
        aiMaterial::AddProperty<aiTextureMapMode>(mat,&wrapT,1,"$tex.mapmodev",texType,texSlot);
        lVar8 = *(long *)(*(long *)&(pvVar5->
                                    super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                    )._M_impl + uVar4 * 8);
        if (*(int *)(lVar8 + 0x50) != 0) {
          aiMaterial::AddProperty<glTF2::SamplerMagFilter>
                    (mat,(SamplerMagFilter *)(lVar8 + 0x50),1,"$tex.mappingfiltermag",texType,
                     texSlot);
          lVar8 = *(long *)(*(long *)&(pvVar5->
                                      super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                      )._M_impl + uVar4 * 8);
        }
        if (*(int *)(lVar8 + 0x54) != 0) {
          aiMaterial::AddProperty<glTF2::SamplerMinFilter>
                    (mat,(SamplerMinFilter *)(lVar8 + 0x54),1,"$tex.mappingfiltermin",texType,
                     texSlot);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void SetFace(aiFace& face, int a, int b)
{
    face.mNumIndices = 2;
    face.mIndices = new unsigned int[2];
    face.mIndices[0] = a;
    face.mIndices[1] = b;
}